

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O0

int ZXing::QRCode::MaskUtil::CalculateMaskPenalty(TritMatrix *matrix)

{
  int iVar1;
  int iVar2;
  TritMatrix *in_stack_00000050;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = ApplyMaskPenaltyRule1
                    ((TritMatrix *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = ApplyMaskPenaltyRule2(matrix);
  iVar1 = iVar1 + iVar2;
  iVar2 = ApplyMaskPenaltyRule3(in_stack_00000050);
  iVar1 = iVar1 + iVar2;
  iVar2 = ApplyMaskPenaltyRule4(matrix);
  return iVar1 + iVar2;
}

Assistant:

int CalculateMaskPenalty(const TritMatrix& matrix)
{
	return MaskUtil::ApplyMaskPenaltyRule1(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule2(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule3(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule4(matrix);
}